

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O2

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody(AbstractTxIn_ConstractorGetterSetter_Test *this)

{
  AbstractTxIn *actual_00;
  AbstractTxIn *actual_01;
  AbstractTxIn actual;
  AbstractTxIn local_128;
  AbstractTxIn local_98;
  
  actual_00 = &actual;
  actual_01 = &actual;
  cfd::core::AbstractTxIn::AbstractTxIn(&actual,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_98,&actual);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_98,actual_00);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_98);
  cfd::core::AbstractTxIn::~AbstractTxIn(&actual);
  cfd::core::AbstractTxIn::AbstractTxIn(&actual,&expect_txid,1,0xffffffff);
  cfd::core::AbstractTxIn::SetUnlockingScript((Script *)&actual);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_128,&actual);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_128,actual_01);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_128);
  cfd::core::AbstractTxIn::~AbstractTxIn(&actual);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}